

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O2

void tcg_gen_ext_i64(TCGContext_conflict9 *tcg_ctx,TCGv_i64 ret,TCGv_i64 val,MemOp opc)

{
  TCGOp *pTVar1;
  
  switch(opc & MO_SSIZE) {
  case MO_8:
    tcg_gen_ext8u_i64_tricore(tcg_ctx,ret,val);
    return;
  case MO_16:
    tcg_gen_ext16u_i64_tricore(tcg_ctx,ret,val);
    return;
  case MO_32:
    tcg_gen_ext32u_i64_tricore(tcg_ctx,ret,val);
    return;
  case MO_64:
    tcg_gen_mov_i64_tricore(tcg_ctx,ret,val);
    return;
  case MO_ASHIFT:
    tcg_gen_ext8s_i64_tricore(tcg_ctx,ret,val);
    return;
  case MO_LESW:
    tcg_gen_ext16s_i64_tricore(tcg_ctx,ret,val);
    return;
  case MO_LESL:
    tcg_gen_ext32s_i64_tricore(tcg_ctx,ret,val);
    return;
  }
  if (ret != val) {
    pTVar1 = tcg_emit_op_tricore(tcg_ctx,INDEX_op_mov_i64);
    pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
    pTVar1->args[1] = (TCGArg)(val + (long)tcg_ctx);
  }
  return;
}

Assistant:

static void tcg_gen_ext_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 val, MemOp opc)
{
    switch (opc & MO_SSIZE) {
    case MO_SB:
        tcg_gen_ext8s_i64(tcg_ctx, ret, val);
        break;
    case MO_UB:
        tcg_gen_ext8u_i64(tcg_ctx, ret, val);
        break;
    case MO_SW:
        tcg_gen_ext16s_i64(tcg_ctx, ret, val);
        break;
    case MO_UW:
        tcg_gen_ext16u_i64(tcg_ctx, ret, val);
        break;
    case MO_SL:
        tcg_gen_ext32s_i64(tcg_ctx, ret, val);
        break;
    case MO_UL:
        tcg_gen_ext32u_i64(tcg_ctx, ret, val);
        break;
    default:
        tcg_gen_mov_i64(tcg_ctx, ret, val);
        break;
    }
}